

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_log.cpp
# Opt level: O1

void __thiscall Kumu::SyslogLogSink::~SyslogLogSink(SyslogLogSink *this)

{
  ~SyslogLogSink(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

Kumu::SyslogLogSink::~SyslogLogSink()
{
  closelog();
}